

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_gz.c
# Opt level: O0

void nhr_gz_write_header(Bytef *buff)

{
  time_t tVar1;
  undefined4 local_18;
  uLong curr_time;
  Bytef *buff_local;
  
  tVar1 = time((time_t *)0x0);
  *buff = '\x1f';
  buff[1] = 0x8b;
  buff[2] = '\b';
  buff[3] = '\0';
  local_18 = (undefined4)tVar1;
  *(undefined4 *)(buff + 4) = local_18;
  buff[8] = '\0';
  buff[9] = '\0';
  return;
}

Assistant:

static void nhr_gz_write_header(Bytef * buff) {
	// used `uLong` as unsigned 32 bit integer
	const uLong curr_time = (uLong)time(NULL);

	*buff++ = 0x1f; // magic header
	*buff++ = 0x8b; // magic header
	*buff++ = 8; // deflate
	*buff++ = 0; // bit 0 set: file probably ascii text

	// 4 bytes file modification time in Unix format
	memcpy(buff, &curr_time, 4);
	buff += 4;

	*buff++ = 0; //2; // XFL = 2 - compressor used maximum compression, slowest algorithm
	*buff = 0; //0xff; // OS type: unknown
}